

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::TrainManager::query_transfer(TrainManager *this,int argc,string *argv)

{
  bool bVar1;
  long lVar2;
  invalid_command *this_00;
  undefined1 *puVar3;
  string *psVar4;
  allocator local_121;
  TrainManager *local_120;
  string date;
  string keyword;
  timeType local_d8;
  timeType local_c8;
  string station [2];
  string local_70;
  string local_50;
  
  lVar2 = 0x10;
  do {
    puVar3 = (undefined1 *)((long)&station[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)&local_c8.month + lVar2) = puVar3;
    *(undefined8 *)((long)station + lVar2 + -8) = 0;
    *puVar3 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x50);
  date._M_dataplus._M_p = (pointer)&date.field_2;
  date._M_string_length = 0;
  date.field_2._M_local_buf[0] = '\0';
  local_120 = this;
  std::__cxx11::string::string((string *)&keyword,"",&local_121);
  lVar2 = 0;
  do {
    if (argc <= lVar2) {
      bVar1 = std::operator==(&keyword,"time");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_50,(string *)&date);
        psVar4 = &local_50;
        timeType::timeType(&local_c8,psVar4);
        query_transfer_cmp<sjtu::cmp_time>(local_120,station,&local_c8);
      }
      else {
        std::__cxx11::string::string((string *)&local_70,(string *)&date);
        psVar4 = &local_70;
        timeType::timeType(&local_d8,psVar4);
        query_transfer_cmp<sjtu::cmp_cost>(local_120,station,&local_d8);
      }
      std::__cxx11::string::~string((string *)psVar4);
      std::__cxx11::string::~string((string *)&keyword);
      std::__cxx11::string::~string((string *)&date);
      lVar2 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&station[0]._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
      return;
    }
    bVar1 = std::operator==(argv,"-s");
    psVar4 = station;
    if (!bVar1) {
      bVar1 = std::operator==(argv,"-t");
      psVar4 = station + 1;
      if (!bVar1) {
        bVar1 = std::operator==(argv,"-d");
        psVar4 = &date;
        if (!bVar1) {
          bVar1 = std::operator==(argv,"-p");
          psVar4 = &keyword;
          if (!bVar1) {
            this_00 = (invalid_command *)__cxa_allocate_exception(0x68);
            invalid_command::invalid_command(this_00);
            __cxa_throw(this_00,&invalid_command::typeinfo,invalid_command::~invalid_command);
          }
        }
      }
    }
    std::__cxx11::string::_M_assign((string *)psVar4);
    lVar2 = lVar2 + 2;
    argv = argv + 2;
  } while( true );
}

Assistant:

void query_transfer(int argc , std::string *argv)
		{
			std::string station[2] , date , keyword = "";
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-s") station[0] = argv[i + 1];
				else if (argv[i] == "-t") station[1] = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else if (argv[i] == "-p") keyword = argv[i + 1];
				else throw invalid_command();
			if (keyword == "time") query_transfer_cmp(station , date , cmp_time());
			else query_transfer_cmp(station , date , cmp_cost());
		}